

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::Desugarer::makeObjectComprehension
          (Desugarer *this,ObjectComprehension *ast,uint obj_level)

{
  sockaddr *__addr;
  initializer_list<jsonnet::internal::Array::Element> __l;
  int iVar1;
  bool bVar2;
  Identifier *pIVar3;
  reference pvVar4;
  reference pCVar5;
  Index *pIVar6;
  Desugarer *this_00;
  ObjectComprehensionSimple *pOVar7;
  int in_EDX;
  long in_RSI;
  int in_EDI;
  AST *arr;
  stringstream num;
  uint in_stack_000002a4;
  AST **in_stack_000002a8;
  Desugarer *in_stack_000002b0;
  ComprehensionSpec *spec;
  iterator __end2;
  iterator __begin2;
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  *__range2;
  Elements arr_e;
  Binds binds;
  int counter;
  AST *zero;
  Identifier *_arr;
  AST *value;
  AST *field;
  SuperVars svs;
  Self *body;
  Identifier *hidden_var;
  undefined1 *in_stack_fffffffffffff988;
  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> *args_2;
  undefined1 *in_stack_fffffffffffff990;
  undefined1 *puVar8;
  LocationRange *in_stack_fffffffffffff998;
  LocationRange *args;
  undefined1 *in_stack_fffffffffffff9a0;
  undefined1 *this_01;
  LocationRange *in_stack_fffffffffffff9a8;
  LocationRange *args_00;
  undefined1 *in_stack_fffffffffffff9b0;
  undefined1 *this_02;
  LocationRange *in_stack_fffffffffffff9b8;
  Desugarer *in_stack_fffffffffffff9c0;
  iterator in_stack_fffffffffffff9c8;
  LocationRange *in_stack_fffffffffffff9d0;
  Desugarer *in_stack_fffffffffffff9d8;
  LiteralNumber **in_stack_fffffffffffffa00;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffa08;
  void **in_stack_fffffffffffffa10;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffffa18;
  void **in_stack_fffffffffffffa20;
  Var *in_stack_fffffffffffffa28;
  undefined1 **local_5a0;
  undefined8 local_540;
  size_type local_538;
  undefined1 local_529;
  undefined8 in_stack_fffffffffffffad8;
  undefined8 in_stack_fffffffffffffae0;
  undefined6 in_stack_fffffffffffffae8;
  undefined1 in_stack_fffffffffffffaee;
  undefined1 in_stack_fffffffffffffaef;
  Fodder *in_stack_fffffffffffffaf0;
  Fodder *in_stack_fffffffffffffaf8;
  undefined8 local_4f8;
  Fodder *in_stack_fffffffffffffb10;
  string local_4e8 [32];
  LiteralNumber *local_4c8;
  undefined1 local_4b9;
  Var *local_4b8;
  Desugarer local_4b0 [11];
  stringstream local_400 [16];
  undefined1 local_3f0 [196];
  uint in_stack_fffffffffffffcd4;
  ObjectFields *in_stack_fffffffffffffcd8;
  AST *in_stack_fffffffffffffce0;
  Desugarer *in_stack_fffffffffffffce8;
  __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
  local_268;
  long local_260;
  undefined8 *local_250;
  undefined1 *local_248 [4];
  undefined8 *local_228;
  undefined8 local_220;
  int local_1e4;
  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  local_1e0 [2];
  Identifier *local_1b0;
  AST *local_1a8;
  AST *local_1a0;
  Self *local_60;
  Identifier *local_20;
  long local_10;
  
  local_10 = in_RSI;
  if (in_EDX == 0) {
    ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2ab331);
    ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffff9d0,(char32_t *)in_stack_fffffffffffff9c8,
               (allocator<char32_t> *)in_stack_fffffffffffff9c0);
    pIVar3 = id((Desugarer *)in_stack_fffffffffffff990,(UString *)in_stack_fffffffffffff988);
    ::std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffff990);
    ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2ab388);
    local_20 = pIVar3;
    local_60 = make<jsonnet::internal::Self,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                         ((Desugarer *)in_stack_fffffffffffff990,
                          (LocationRange *)in_stack_fffffffffffff988,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)0x2ab3bb);
    in_stack_fffffffffffff988 = EF;
    ObjectField::Local(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
                       (Identifier *)
                       CONCAT17(in_stack_fffffffffffffaef,
                                CONCAT16(in_stack_fffffffffffffaee,in_stack_fffffffffffffae8)),
                       (Fodder *)in_stack_fffffffffffffae0,(AST *)in_stack_fffffffffffffad8,
                       in_stack_fffffffffffffb10);
    ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
    push_back((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
               *)in_stack_fffffffffffff990,(value_type *)in_stack_fffffffffffff988);
    ObjectField::~ObjectField((ObjectField *)in_stack_fffffffffffff990);
  }
  desugarFields(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                in_stack_fffffffffffffcd4);
  pvVar4 = ::std::
           vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
           front((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                  *)in_stack_fffffffffffff990);
  local_1a0 = pvVar4->expr1;
  pvVar4 = ::std::
           vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
           front((vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                  *)in_stack_fffffffffffff990);
  local_1a8 = pvVar4->expr2;
  ::std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2ab523);
  ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff9d0,(char32_t *)in_stack_fffffffffffff9c8,
             (allocator<char32_t> *)in_stack_fffffffffffff9c0);
  pIVar3 = id((Desugarer *)in_stack_fffffffffffff990,(UString *)in_stack_fffffffffffff988);
  ::std::__cxx11::u32string::~u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             in_stack_fffffffffffff990);
  ::std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2ab57a);
  local_1b0 = pIVar3;
  local_1e0[0].
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,char_const(&)[4]>
                          ((Desugarer *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)in_stack_fffffffffffff990,(char (*) [4])in_stack_fffffffffffff988);
  local_1e4 = 1;
  ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
  vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> *)
         0x2ab5de);
  local_250 = local_248;
  Array::Element::Element
            ((Element *)in_stack_fffffffffffff990,(AST *)in_stack_fffffffffffff988,
             (Fodder *)0x2ab602);
  local_228 = local_248;
  local_220 = 1;
  ::std::allocator<jsonnet::internal::Array::Element>::allocator
            ((allocator<jsonnet::internal::Array::Element> *)0x2ab635);
  __l._M_len = (size_type)in_stack_fffffffffffff9d0;
  __l._M_array = in_stack_fffffffffffff9c8;
  ::std::
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>::
  vector((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
          *)in_stack_fffffffffffff9c0,__l,(allocator_type *)in_stack_fffffffffffff9b8);
  ::std::allocator<jsonnet::internal::Array::Element>::~allocator
            ((allocator<jsonnet::internal::Array::Element> *)0x2ab669);
  local_5a0 = (undefined1 **)&local_228;
  do {
    local_5a0 = local_5a0 + -4;
    Array::Element::~Element((Element *)0x2ab69e);
  } while (local_5a0 != local_248);
  local_260 = local_10 + 0xa0;
  local_268._M_current =
       (ComprehensionSpec *)
       ::std::
       vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
       ::begin((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                *)in_stack_fffffffffffff988);
  ::std::
  vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
  ::end((vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
         *)in_stack_fffffffffffff988);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
                        *)in_stack_fffffffffffff990,
                       (__normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
                        *)in_stack_fffffffffffff988);
    if (!bVar2) break;
    pCVar5 = __gnu_cxx::
             __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
             ::operator*(&local_268);
    if (pCVar5->kind == FOR) {
      ::std::__cxx11::stringstream::stringstream(local_400);
      iVar1 = local_1e4;
      local_1e4 = local_1e4 + 1;
      ::std::ostream::operator<<(local_3f0,iVar1);
      __addr = (sockaddr *)pCVar5->var;
      local_4b8 = var((Desugarer *)in_stack_fffffffffffff990,(Identifier *)in_stack_fffffffffffff988
                     );
      local_4b9 = 0;
      ::std::__cxx11::stringstream::str();
      local_4c8 = make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::string>
                            ((Desugarer *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)in_stack_fffffffffffff990,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff988);
      local_4f8._0_1_ = (_Alloc_hider)0x0;
      local_4f8._1_7_ = 0;
      in_stack_fffffffffffff9b0 = EF;
      in_stack_fffffffffffff9a8 = (LocationRange *)&local_4f8;
      in_stack_fffffffffffff9a0 = EF;
      in_stack_fffffffffffff998 = (LocationRange *)&stack0xfffffffffffffb10;
      in_stack_fffffffffffff990 = EF;
      in_stack_fffffffffffff988 = (undefined1 *)&local_4c8;
      pIVar6 = make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralNumber*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                         (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffff9c8,(Var **)in_stack_fffffffffffff9c0,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffff9b8,(bool *)EF,in_stack_fffffffffffffa00,
                          in_stack_fffffffffffffa08,in_stack_fffffffffffffa10,
                          in_stack_fffffffffffffa18,in_stack_fffffffffffffa20,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)in_stack_fffffffffffffa28);
      bind(local_4b0,in_EDI,__addr,(socklen_t)pIVar6);
      ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
      ::push_back((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                   *)in_stack_fffffffffffff990,(value_type *)in_stack_fffffffffffff988);
      Local::Bind::~Bind((Bind *)in_stack_fffffffffffff990);
      ::std::__cxx11::string::~string(local_4e8);
      in_stack_fffffffffffffa28 =
           var((Desugarer *)in_stack_fffffffffffff990,(Identifier *)in_stack_fffffffffffff988);
      ::std::
      vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>::
      emplace_back<jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                ((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
                  *)in_stack_fffffffffffff9a0,(Var **)in_stack_fffffffffffff998,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)in_stack_fffffffffffff990);
      ::std::__cxx11::stringstream::~stringstream(local_400);
    }
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::ComprehensionSpec_*,_std::vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>_>
    ::operator++(&local_268);
  }
  make<jsonnet::internal::Array,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>&,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
            ((Desugarer *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_fffffffffffff9a0,
             (vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
              *)in_stack_fffffffffffff998,(bool *)in_stack_fffffffffffff990,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_fffffffffffff988);
  pIVar3 = (Identifier *)(local_10 + 0xa0);
  puVar8 = EF;
  make<jsonnet::internal::ArrayComprehension,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Array*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,std::vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
            (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_fffffffffffff9b0,(Array **)in_stack_fffffffffffff9a8,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_fffffffffffff9a0,(bool *)in_stack_fffffffffffff998,
             (vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
              *)in_stack_fffffffffffff9d0,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_fffffffffffff9d8);
  desugar(in_stack_000002b0,in_stack_000002a8,in_stack_000002a4);
  this_00 = (Desugarer *)(local_10 + 8);
  var((Desugarer *)puVar8,pIVar3);
  local_529 = '\0';
  local_538 = 0;
  local_540._0_1_ = (_Alloc_hider)0x0;
  local_540._1_7_ = 0;
  this_02 = EF;
  args_00 = (LocationRange *)&local_540;
  this_01 = EF;
  args = (LocationRange *)&local_538;
  puVar8 = EF;
  args_2 = local_1e0;
  make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
            (this_00,in_stack_fffffffffffff9d0,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_fffffffffffff9c8,(Var **)in_stack_fffffffffffff9c0,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_fffffffffffff9b8,(bool *)EF,(AST **)in_stack_fffffffffffffa00,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa10,in_stack_fffffffffffffa18,
             in_stack_fffffffffffffa20,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)in_stack_fffffffffffffa28);
  make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>&,jsonnet::internal::AST*&>
            ((Desugarer *)this_01,args,
             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)puVar8,args_2,(AST **)0x2abcf5);
  pOVar7 = make<jsonnet::internal::ObjectComprehensionSimple,jsonnet::internal::LocationRange&,jsonnet::internal::Index*,jsonnet::internal::Local*,jsonnet::internal::Identifier_const*&,jsonnet::internal::AST*&>
                     ((Desugarer *)this_02,args_00,(Index **)this_01,(Local **)args,
                      (Identifier **)puVar8,(AST **)args_2);
  ::std::
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>::
  ~vector((vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
           *)this_01);
  ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
  ~vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> *
          )this_01);
  ::std::
  vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
  ::~vector((vector<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
             *)this_01);
  return &pOVar7->super_AST;
}

Assistant:

AST* makeObjectComprehension(ObjectComprehension *ast, unsigned obj_level) {
        // Hidden variable to allow outer/top binding.
        if (obj_level == 0) {
            const Identifier *hidden_var = id(U"$");
            auto *body = make<Self>(E, EF);
            ast->fields.push_back(ObjectField::Local(EF, EF, hidden_var, EF, body, EF));
        }

        SuperVars svs = desugarFields(ast, ast->fields, obj_level);

        AST *field = ast->fields.front().expr1;
        AST *value = ast->fields.front().expr2;

        /*  {
            [arr[0]]: local x = arr[1], y = arr[2], z = arr[3]; val_expr
            for arr in [ [key_expr, x, y, z] for ...  ]
            }
        */
        auto *_arr = id(U"$arr");
        AST *zero = make<LiteralNumber>(E, EF, "0.0");
        int counter = 1;
        Local::Binds binds;
        Array::Elements arr_e{Array::Element(field, EF)};
        for (ComprehensionSpec &spec : ast->specs) {
            if (spec.kind == ComprehensionSpec::FOR) {
                std::stringstream num;
                num << counter++;
                binds.push_back(bind(spec.var,
                                     make<Index>(E,
                                                 EF,
                                                 var(_arr),
                                                 EF,
                                                 false,
                                                 make<LiteralNumber>(E, EF, num.str()),
                                                 EF,
                                                 nullptr,
                                                 EF,
                                                 nullptr,
                                                 EF)));
                arr_e.emplace_back(var(spec.var), EF);
            }
        }
        AST *arr = make<ArrayComprehension>(ast->location,
                                            EF,
                                            make<Array>(ast->location, EF, arr_e, false, EF),
                                            EF,
                                            false,
                                            ast->specs,
                                            EF);
        desugar(arr, obj_level);
        return make<ObjectComprehensionSimple>(
            ast->location,
            make<Index>(E, EF, var(_arr), EF, false, zero, EF, nullptr, EF, nullptr, EF),
            make<Local>(ast->location, EF, binds, value),
            _arr,
            arr);
    }